

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::CompilerGLSL::enclose_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,string *expr)

{
  bool bVar1;
  char *in_R8;
  _Alloc_hider local_22;
  diligent_spirv_cross local_21;
  string *local_20;
  string *expr_local;
  CompilerGLSL *this_local;
  
  local_20 = expr;
  expr_local = (string *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  bVar1 = needs_enclose_expression(expr);
  if (bVar1) {
    local_21 = (diligent_spirv_cross)0x28;
    local_22 = (_Alloc_hider)0x29;
    join<char,std::__cxx11::string_const&,char>
              (__return_storage_ptr__,&local_21,(char *)local_20,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_22,in_R8)
    ;
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::enclose_expression(const string &expr)
{
	// If this expression contains any spaces which are not enclosed by parentheses,
	// we need to enclose it so we can treat the whole string as an expression.
	// This happens when two expressions have been part of a binary op earlier.
	if (needs_enclose_expression(expr))
		return join('(', expr, ')');
	else
		return expr;
}